

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::InstanceArrayIntersector1>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined1 (*pauVar4) [16];
  byte bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  undefined4 uVar9;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  Primitive *prim;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar28;
  float fVar29;
  undefined1 auVar25 [16];
  float fVar30;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar31;
  float fVar34;
  float fVar35;
  undefined1 auVar32 [16];
  float fVar36;
  undefined1 auVar33 [16];
  float fVar37;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar63;
  float fVar64;
  undefined1 auVar62 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1048 [6];
  undefined1 (*local_1030) [16];
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [8];
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_f78 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_f70 = 0;
  local_fa8 = (query->p).field_0.field_0.x;
  local_fb8 = (query->p).field_0.field_0.y;
  local_fc8 = (query->p).field_0.field_0.z;
  fVar61 = (context->query_radius).field_0.m128[0];
  fVar63 = (context->query_radius).field_0.m128[1];
  fVar64 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_f98 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    local_f98 = dpps((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
  }
  local_1030 = (undefined1 (*) [16])local_f68;
  bVar7 = false;
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  do {
    local_ff8 = local_fa8 - fVar61;
    fStack_ff4 = fStack_fa4 - fVar61;
    fStack_ff0 = fStack_fa0 - fVar61;
    fStack_fec = fStack_f9c - fVar61;
    local_1008 = local_fa8 + fVar61;
    fStack_1004 = fStack_fa4 + fVar61;
    fStack_1000 = fStack_fa0 + fVar61;
    fStack_ffc = fStack_f9c + fVar61;
    local_1018._0_4_ = local_fb8 - fVar63;
    local_1018._4_4_ = fStack_fb4 - fVar63;
    fStack_1010 = fStack_fb0 - fVar63;
    fStack_100c = fStack_fac - fVar63;
    local_fd8 = fVar63 + local_fb8;
    fStack_fd4 = fVar63 + fStack_fb4;
    fStack_fd0 = fVar63 + fStack_fb0;
    fStack_fcc = fVar63 + fStack_fac;
    local_1028 = local_fc8 - fVar64;
    fStack_1024 = fStack_fc4 - fVar64;
    fStack_1020 = fStack_fc0 - fVar64;
    fStack_101c = fStack_fbc - fVar64;
    local_fe8._0_4_ = fVar64 + local_fc8;
    local_fe8._4_4_ = fVar64 + fStack_fc4;
    fStack_fe0 = fVar64 + fStack_fc0;
    fStack_fdc = fVar64 + fStack_fbc;
    local_f88 = fVar61 * fVar61;
    fStack_f84 = fVar61 * fVar61;
    fStack_f80 = fVar61 * fVar61;
    fStack_f7c = fVar61 * fVar61;
    fVar63 = local_fa8;
    fVar64 = fStack_fa4;
    fVar48 = fStack_fa0;
    fVar49 = fStack_f9c;
    fVar50 = local_fb8;
    fVar51 = fStack_fb4;
    fVar52 = fStack_fb0;
    fVar53 = fStack_fac;
    fVar61 = local_fc8;
    fVar54 = fStack_fc4;
    fVar55 = fStack_fc0;
    fVar56 = fStack_fbc;
    fVar57 = fVar61 * fVar61;
    fVar58 = fVar61 * fVar61;
    fVar59 = fVar61 * fVar61;
    fVar60 = fVar61 * fVar61;
    auVar62 = local_f98;
    do {
      do {
        do {
          if (local_1030 == (undefined1 (*) [16])local_f78) {
            return bVar7;
          }
          pauVar4 = local_1030 + -1;
          local_1030 = local_1030 + -1;
        } while (auVar62._0_4_ < *(float *)(*pauVar4 + 8));
        uVar13 = *(ulong *)*local_1030;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar13 & 8) == 0) {
              auVar23 = *(undefined1 (*) [16])(uVar13 + 0x20);
              auVar27 = *(undefined1 (*) [16])(uVar13 + 0x30);
              auVar25._4_4_ = fVar64;
              auVar25._0_4_ = fVar63;
              auVar25._8_4_ = fVar48;
              auVar25._12_4_ = fVar49;
              auVar25 = maxps(auVar25,auVar23);
              auVar25 = minps(auVar25,auVar27);
              auVar32._4_4_ = fVar51;
              auVar32._0_4_ = fVar50;
              auVar32._8_4_ = fVar52;
              auVar32._12_4_ = fVar53;
              auVar32 = maxps(auVar32,*(undefined1 (*) [16])(uVar13 + 0x40));
              fVar24 = auVar25._0_4_ - fVar63;
              fVar28 = auVar25._4_4_ - fVar64;
              fVar29 = auVar25._8_4_ - fVar48;
              fVar30 = auVar25._12_4_ - fVar49;
              auVar25 = minps(auVar32,*(undefined1 (*) [16])(uVar13 + 0x50));
              auVar43._4_4_ = fVar54;
              auVar43._0_4_ = fVar61;
              auVar43._8_4_ = fVar55;
              auVar43._12_4_ = fVar56;
              auVar32 = maxps(auVar43,*(undefined1 (*) [16])(uVar13 + 0x60));
              auVar32 = minps(auVar32,*(undefined1 (*) [16])(uVar13 + 0x70));
              fVar31 = auVar25._0_4_ - fVar50;
              fVar34 = auVar25._4_4_ - fVar51;
              fVar35 = auVar25._8_4_ - fVar52;
              fVar36 = auVar25._12_4_ - fVar53;
              fVar37 = auVar32._0_4_ - fVar61;
              fVar39 = auVar32._4_4_ - fVar54;
              fVar40 = auVar32._8_4_ - fVar55;
              fVar41 = auVar32._12_4_ - fVar56;
              local_1048[0] = fVar37 * fVar37 + fVar31 * fVar31 + fVar24 * fVar24;
              local_1048[1] = fVar39 * fVar39 + fVar34 * fVar34 + fVar28 * fVar28;
              local_1048[2] = fVar40 * fVar40 + fVar35 * fVar35 + fVar29 * fVar29;
              local_1048[3] = fVar41 * fVar41 + fVar36 * fVar36 + fVar30 * fVar30;
              auVar45._0_4_ = -(uint)(auVar23._0_4_ <= auVar27._0_4_ && local_1048[0] <= fVar57);
              auVar45._4_4_ = -(uint)(auVar23._4_4_ <= auVar27._4_4_ && local_1048[1] <= fVar58);
              auVar45._8_4_ = -(uint)(auVar23._8_4_ <= auVar27._8_4_ && local_1048[2] <= fVar59);
              auVar45._12_4_ = -(uint)(auVar23._12_4_ <= auVar27._12_4_ && local_1048[3] <= fVar60);
LAB_00e8cfff:
              uVar9 = movmskps((int)unaff_RBP,auVar45);
              unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar9);
            }
          }
          else if ((uVar13 & 8) == 0) {
            auVar23 = *(undefined1 (*) [16])(uVar13 + 0x60);
            auVar27 = *(undefined1 (*) [16])(uVar13 + 0x20);
            auVar25 = *(undefined1 (*) [16])(uVar13 + 0x30);
            auVar32 = *(undefined1 (*) [16])(uVar13 + 0x40);
            auVar43 = *(undefined1 (*) [16])(uVar13 + 0x50);
            auVar15 = *(undefined1 (*) [16])(uVar13 + 0x70);
            auVar44._4_4_ = fVar64;
            auVar44._0_4_ = fVar63;
            auVar44._8_4_ = fVar48;
            auVar44._12_4_ = fVar49;
            auVar45 = maxps(auVar44,auVar27);
            auVar45 = minps(auVar45,auVar25);
            fVar24 = auVar45._0_4_ - fVar63;
            fVar29 = auVar45._4_4_ - fVar64;
            fVar31 = auVar45._8_4_ - fVar48;
            fVar35 = auVar45._12_4_ - fVar49;
            auVar47._4_4_ = fVar51;
            auVar47._0_4_ = fVar50;
            auVar47._8_4_ = fVar52;
            auVar47._12_4_ = fVar53;
            auVar45 = maxps(auVar47,auVar32);
            auVar45 = minps(auVar45,auVar43);
            fVar37 = auVar45._0_4_ - fVar50;
            fVar39 = auVar45._4_4_ - fVar51;
            fVar40 = auVar45._8_4_ - fVar52;
            fVar41 = auVar45._12_4_ - fVar53;
            auVar46._4_4_ = fVar54;
            auVar46._0_4_ = fVar61;
            auVar46._8_4_ = fVar55;
            auVar46._12_4_ = fVar56;
            auVar45 = maxps(auVar46,auVar23);
            auVar45 = minps(auVar45,auVar15);
            fVar28 = auVar45._0_4_ - fVar61;
            fVar30 = auVar45._4_4_ - fVar54;
            fVar34 = auVar45._8_4_ - fVar55;
            fVar36 = auVar45._12_4_ - fVar56;
            local_1048[0] = fVar28 * fVar28 + fVar37 * fVar37 + fVar24 * fVar24;
            local_1048[1] = fVar30 * fVar30 + fVar39 * fVar39 + fVar29 * fVar29;
            local_1048[2] = fVar34 * fVar34 + fVar40 * fVar40 + fVar31 * fVar31;
            local_1048[3] = fVar36 * fVar36 + fVar41 * fVar41 + fVar35 * fVar35;
            auVar45._0_4_ =
                 (uint)(((auVar23._0_4_ <= (float)local_fe8._0_4_ && local_ff8 <= auVar25._0_4_) &&
                        (auVar32._0_4_ <= local_fd8 && auVar27._0_4_ <= local_1008)) &&
                       (local_1028 <= auVar15._0_4_ &&
                       ((float)local_1018._0_4_ <= auVar43._0_4_ && auVar27._0_4_ <= auVar25._0_4_))
                       ) * -0x80000000;
            auVar45._4_4_ =
                 (uint)(((auVar23._4_4_ <= (float)local_fe8._4_4_ && fStack_ff4 <= auVar25._4_4_) &&
                        (auVar32._4_4_ <= fStack_fd4 && auVar27._4_4_ <= fStack_1004)) &&
                       (fStack_1024 <= auVar15._4_4_ &&
                       ((float)local_1018._4_4_ <= auVar43._4_4_ && auVar27._4_4_ <= auVar25._4_4_))
                       ) * -0x80000000;
            auVar45._8_4_ =
                 (uint)(((auVar23._8_4_ <= fStack_fe0 && fStack_ff0 <= auVar25._8_4_) &&
                        (auVar32._8_4_ <= fStack_fd0 && auVar27._8_4_ <= fStack_1000)) &&
                       (fStack_1020 <= auVar15._8_4_ &&
                       (fStack_1010 <= auVar43._8_4_ && auVar27._8_4_ <= auVar25._8_4_))) *
                 -0x80000000;
            auVar45._12_4_ =
                 (uint)(((auVar23._12_4_ <= fStack_fdc && fStack_fec <= auVar25._12_4_) &&
                        (auVar32._12_4_ <= fStack_fcc && auVar27._12_4_ <= fStack_ffc)) &&
                       (fStack_101c <= auVar15._12_4_ &&
                       (fStack_100c <= auVar43._12_4_ && auVar27._12_4_ <= auVar25._12_4_))) *
                 -0x80000000;
            goto LAB_00e8cfff;
          }
          if ((uVar13 & 8) == 0) {
            if (unaff_RBP == 0) {
              iVar8 = 4;
            }
            else {
              uVar12 = uVar13 & 0xfffffffffffffff0;
              lVar14 = 0;
              if (unaff_RBP != 0) {
                for (; (unaff_RBP >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                }
              }
              iVar8 = 0;
              uVar13 = *(ulong *)(uVar12 + lVar14 * 8);
              uVar10 = unaff_RBP - 1 & unaff_RBP;
              if (uVar10 != 0) {
                fVar24 = local_1048[lVar14];
                lVar14 = 0;
                if (uVar10 != 0) {
                  for (; (uVar10 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                  }
                }
                uVar2 = *(ulong *)(uVar12 + lVar14 * 8);
                fVar28 = local_1048[lVar14];
                uVar10 = uVar10 - 1 & uVar10;
                if (uVar10 == 0) {
                  if ((uint)fVar24 < (uint)fVar28) {
                    *(ulong *)*local_1030 = uVar2;
                    *(float *)(*local_1030 + 8) = fVar28;
                    local_1030 = local_1030 + 1;
                  }
                  else {
                    *(ulong *)*local_1030 = uVar13;
                    *(float *)(*local_1030 + 8) = fVar24;
                    local_1030 = local_1030 + 1;
                    uVar13 = uVar2;
                  }
                }
                else {
                  auVar23._8_4_ = fVar24;
                  auVar23._0_8_ = uVar13;
                  auVar23._12_4_ = 0;
                  auVar27._8_4_ = fVar28;
                  auVar27._0_8_ = uVar2;
                  auVar27._12_4_ = 0;
                  lVar14 = 0;
                  if (uVar10 != 0) {
                    for (; (uVar10 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                    }
                  }
                  uVar3 = *(undefined8 *)(uVar12 + lVar14 * 8);
                  fVar29 = local_1048[lVar14];
                  auVar26._8_4_ = fVar29;
                  auVar26._0_8_ = uVar3;
                  auVar26._12_4_ = 0;
                  auVar15._8_4_ = -(uint)((int)fVar24 < (int)fVar28);
                  uVar10 = uVar10 - 1 & uVar10;
                  if (uVar10 == 0) {
                    auVar15._4_4_ = auVar15._8_4_;
                    auVar15._0_4_ = auVar15._8_4_;
                    auVar15._12_4_ = auVar15._8_4_;
                    auVar33._8_4_ = fVar28;
                    auVar33._0_8_ = uVar2;
                    auVar33._12_4_ = 0;
                    auVar25 = blendvps(auVar33,auVar23,auVar15);
                    auVar23 = blendvps(auVar23,auVar27,auVar15);
                    auVar16._8_4_ = -(uint)(auVar25._8_4_ < (int)fVar29);
                    auVar16._4_4_ = auVar16._8_4_;
                    auVar16._0_4_ = auVar16._8_4_;
                    auVar16._12_4_ = auVar16._8_4_;
                    auVar38._8_4_ = fVar29;
                    auVar38._0_8_ = uVar3;
                    auVar38._12_4_ = 0;
                    auVar32 = blendvps(auVar38,auVar25,auVar16);
                    auVar25 = blendvps(auVar25,auVar26,auVar16);
                    auVar17._8_4_ = -(uint)(auVar23._8_4_ < auVar25._8_4_);
                    auVar17._4_4_ = auVar17._8_4_;
                    auVar17._0_4_ = auVar17._8_4_;
                    auVar17._12_4_ = auVar17._8_4_;
                    auVar27 = blendvps(auVar25,auVar23,auVar17);
                    auVar23 = blendvps(auVar23,auVar25,auVar17);
                    *local_1030 = auVar23;
                    local_1030[1] = auVar27;
                    local_1030 = local_1030 + 2;
                    uVar13 = auVar32._0_8_;
                  }
                  else {
                    lVar14 = 0;
                    if (uVar10 != 0) {
                      for (; (uVar10 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                      }
                    }
                    auVar18._4_4_ = auVar15._8_4_;
                    auVar18._0_4_ = auVar15._8_4_;
                    auVar18._8_4_ = auVar15._8_4_;
                    auVar18._12_4_ = auVar15._8_4_;
                    auVar25 = blendvps(auVar27,auVar23,auVar18);
                    auVar23 = blendvps(auVar23,auVar27,auVar18);
                    auVar42._8_4_ = local_1048[lVar14];
                    auVar42._0_8_ = *(undefined8 *)(uVar12 + lVar14 * 8);
                    auVar42._12_4_ = 0;
                    auVar19._8_4_ = -(uint)((int)fVar29 < (int)local_1048[lVar14]);
                    auVar19._4_4_ = auVar19._8_4_;
                    auVar19._0_4_ = auVar19._8_4_;
                    auVar19._12_4_ = auVar19._8_4_;
                    auVar32 = blendvps(auVar42,auVar26,auVar19);
                    auVar27 = blendvps(auVar26,auVar42,auVar19);
                    auVar20._8_4_ = -(uint)(auVar23._8_4_ < auVar27._8_4_);
                    auVar20._4_4_ = auVar20._8_4_;
                    auVar20._0_4_ = auVar20._8_4_;
                    auVar20._12_4_ = auVar20._8_4_;
                    auVar43 = blendvps(auVar27,auVar23,auVar20);
                    auVar23 = blendvps(auVar23,auVar27,auVar20);
                    auVar21._8_4_ = -(uint)(auVar25._8_4_ < auVar32._8_4_);
                    auVar21._4_4_ = auVar21._8_4_;
                    auVar21._0_4_ = auVar21._8_4_;
                    auVar21._12_4_ = auVar21._8_4_;
                    auVar27 = blendvps(auVar32,auVar25,auVar21);
                    auVar25 = blendvps(auVar25,auVar32,auVar21);
                    auVar22._8_4_ = -(uint)(auVar25._8_4_ < auVar43._8_4_);
                    auVar22._4_4_ = auVar22._8_4_;
                    auVar22._0_4_ = auVar22._8_4_;
                    auVar22._12_4_ = auVar22._8_4_;
                    auVar32 = blendvps(auVar43,auVar25,auVar22);
                    auVar25 = blendvps(auVar25,auVar43,auVar22);
                    *local_1030 = auVar23;
                    local_1030[1] = auVar25;
                    local_1030[2] = auVar32;
                    local_1030 = local_1030 + 3;
                    uVar13 = auVar27._0_8_;
                    iVar8 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar8 = 6;
          }
        } while (iVar8 == 0);
      } while ((iVar8 != 6) || (lVar14 = (ulong)((uint)uVar13 & 0xf) - 8, lVar14 == 0));
      prim = (Primitive *)(uVar13 & 0xfffffffffffffff0);
      bVar5 = 0;
      do {
        bVar11 = bVar5;
        bVar6 = InstanceArrayIntersector1::pointQuery(query,context,prim);
        prim = prim + 1;
        lVar14 = lVar14 + -1;
        bVar5 = bVar11 | bVar6;
      } while (lVar14 != 0);
      fVar63 = local_fa8;
      fVar64 = fStack_fa4;
      fVar48 = fStack_fa0;
      fVar49 = fStack_f9c;
      fVar50 = local_fb8;
      fVar51 = fStack_fb4;
      fVar52 = fStack_fb0;
      fVar53 = fStack_fac;
      fVar61 = local_fc8;
      fVar54 = fStack_fc4;
      fVar55 = fStack_fc0;
      fVar56 = fStack_fbc;
      fVar57 = local_f88;
      fVar58 = fStack_f84;
      fVar59 = fStack_f80;
      fVar60 = fStack_f7c;
      auVar62 = local_f98;
    } while (bVar11 == 0 && !bVar6);
    auVar62 = *(undefined1 (*) [16])(context->query_radius).field_0.m128;
    fVar61 = auVar62._0_4_;
    fVar63 = auVar62._4_4_;
    fVar64 = auVar62._8_4_;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_f98 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      local_f98 = dpps(auVar62,auVar62,0x7f);
    }
    bVar7 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }